

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mo_lambda.cpp
# Opt level: O0

plural_ptr __thiscall
booster::locale::gnu_gettext::lambda::anon_unknown_0::parser::cond_expr(parser *this)

{
  int iVar1;
  pointer ppVar2;
  conditional *this_00;
  plural_ptr *p2;
  plural_ptr *p3;
  undefined8 *in_RSI;
  __uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
  in_RDI;
  plural_ptr case2;
  plural_ptr case1;
  plural_ptr cond;
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
  *in_stack_ffffffffffffff28;
  tokenizer *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff58;
  tokenizer local_58;
  undefined4 local_40;
  parser *in_stack_ffffffffffffffc8;
  parser *in_stack_ffffffffffffffe8;
  
  std::
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
  ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
            ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
              *)in_stack_ffffffffffffff30);
  std::
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
  ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
            ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
              *)in_stack_ffffffffffffff30);
  std::
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
  ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
            ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
              *)in_stack_ffffffffffffff30);
  l1(in_stack_ffffffffffffffc8);
  std::
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
  ::operator=((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
               *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  ppVar2 = std::
           unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
           ::get((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                  *)in_stack_ffffffffffffff30);
  std::
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
  ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                 *)in_stack_ffffffffffffff30);
  if (ppVar2 == (pointer)0x0) {
    std::
    unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
    ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
              ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                *)in_stack_ffffffffffffff30);
  }
  else {
    iVar1 = tokenizer::next((tokenizer *)*in_RSI,(int *)0x0);
    if (iVar1 == 0x3f) {
      tokenizer::get(in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28);
      cond_expr(in_stack_ffffffffffffffe8);
      std::
      unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
      ::operator=((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                   *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      this_00 = (conditional *)
                std::
                unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                ::get((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                       *)in_stack_ffffffffffffff30);
      std::
      unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
      ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                     *)in_stack_ffffffffffffff30);
      if (this_00 == (conditional *)0x0) {
        std::
        unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
        ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
                  ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                    *)in_stack_ffffffffffffff30);
      }
      else {
        iVar1 = tokenizer::get(in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28);
        if (iVar1 == 0x3a) {
          cond_expr(in_stack_ffffffffffffffe8);
          std::
          unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
          ::operator=((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                       *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          p2 = (plural_ptr *)
               std::
               unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
               ::get((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                      *)in_stack_ffffffffffffff30);
          std::
          unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
          ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                         *)in_stack_ffffffffffffff30);
          if (p2 == (plural_ptr *)0x0) {
            std::
            unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
            ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
                      ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                        *)in_stack_ffffffffffffff30);
          }
          else {
            p3 = (plural_ptr *)operator_new(0x20);
            in_stack_ffffffffffffff30 = &local_58;
            std::
            unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
            ::unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                          *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
            std::
            unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
            ::unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                          *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
            std::
            unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
            ::unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                          *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
            conditional::conditional
                      (this_00,(plural_ptr *)CONCAT44(iVar1,in_stack_ffffffffffffff58),p2,p3);
            std::
            unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
            ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
                      ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                        *)in_stack_ffffffffffffff30,(pointer)in_stack_ffffffffffffff28);
            std::
            unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
            ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                           *)in_stack_ffffffffffffff30);
            std::
            unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
            ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                           *)in_stack_ffffffffffffff30);
            std::
            unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
            ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                           *)in_stack_ffffffffffffff30);
          }
        }
        else {
          std::
          unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
          ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
                    ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                      *)in_stack_ffffffffffffff30);
        }
      }
    }
    else {
      std::
      unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
      ::unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                    *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
  }
  local_40 = 1;
  std::
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
  ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                 *)in_stack_ffffffffffffff30);
  std::
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
  ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                 *)in_stack_ffffffffffffff30);
  std::
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
  ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                 *)in_stack_ffffffffffffff30);
  return (__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
          )(tuple<booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
            )in_RDI.
             super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
             ._M_t.
             super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
             .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>.
             _M_head_impl;
}

Assistant:

plural_ptr cond_expr()
        {
            plural_ptr cond,case1,case2;
            if((cond=l1()).get()==0)
                return plural_ptr();
            if(t.next()=='?') {
                t.get();
                if((case1=cond_expr()).get()==0)
                    return plural_ptr();
                if(t.get()!=':')
                    return plural_ptr();
                if((case2=cond_expr()).get()==0)
                    return plural_ptr();
            }
            else {
                return cond;
            }
            return plural_ptr(new conditional(std::move(cond),std::move(case1),std::move(case2)));
        }